

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply.c
# Opt level: O0

int use_mirror(obj *obj)

{
  uint uVar1;
  monst *mtmp_00;
  boolean bVar2;
  byte bVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  bool bVar7;
  bool local_5b;
  byte local_5a;
  byte local_59;
  char *local_58;
  int local_2c;
  char local_25;
  int tmp;
  schar dz;
  schar dy;
  schar dx;
  boolean vis;
  monst *pmStack_20;
  char mlet;
  monst *mtmp;
  obj *obj_local;
  
  mtmp = (monst *)obj;
  iVar4 = getdir((char *)0x0,(schar *)((long)&tmp + 1),(schar *)&tmp,&local_25);
  if (iVar4 == 0) {
    return 0;
  }
  if (((*(uint *)(mtmp->mtrack + 3) & 1) != 0) && (iVar4 = rn2(2), iVar4 == 0)) {
    if (((u.uprops[0x1e].intrinsic == 0) &&
        (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
         (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
       ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
      pline("The mirror fogs up and doesn\'t reflect!");
    }
    return 1;
  }
  if (((tmp._1_1_ == '\0') && ((char)tmp == '\0')) && (local_25 == '\0')) {
    if ((((u.uprops[0x1e].intrinsic == 0) &&
         (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
          (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
        ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
       ((((u.uprops[0xd].intrinsic == 0 &&
          ((u.uprops[0xd].extrinsic == 0 && (youmonst.data != mons + 0x9e)))) &&
         (youmonst.data != mons + 0x7b)) ||
        ((((u.uprops[0xd].blocked != 0 || (u.uprops[0xc].intrinsic != 0)) ||
          (u.uprops[0xc].extrinsic != 0)) || (((youmonst.data)->mflags1 & 0x1000000) != 0)))))) {
      if (u.umonnum == 0x1e) {
        if (u.uprops[0x38].extrinsic == 0) {
          bVar7 = false;
          if (u.uprops[0x23].intrinsic != 0) {
            bVar7 = true;
            if ((u.uprops[0x24].extrinsic == 0) && (bVar7 = false, u.umonster != 0x1e)) {
              bVar2 = dmgtype(youmonst.data,0x24);
              bVar7 = bVar2 != '\0';
            }
            bVar7 = (bool)(bVar7 ^ 1);
          }
          pcVar6 = "Yikes!  You\'ve frozen yourself!";
          if (bVar7) {
            pcVar6 = "Yow!  The mirror stares back!";
          }
          pline(pcVar6);
          iVar4 = rnd(0x24 - u.ulevel);
          nomul(-iVar4,"gazing into a mirror");
        }
        else {
          pline("You stiffen momentarily under your gaze.");
        }
      }
      else if (((youmonst.data)->mlet == '0') || (((youmonst.data)->mflags2 & 0x100) != 0)) {
        pline("You don\'t have a reflection.");
      }
      else if (u.umonnum == 0xe7) {
        pline("Huh?  That doesn\'t look like you!");
        uVar1 = u.uprops[0x1c].intrinsic;
        iVar4 = dice(3,4);
        make_confused((ulong)(uVar1 + iVar4),'\0');
      }
      else if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
              ((u.umonnum != u.umonster && (bVar2 = dmgtype(youmonst.data,0x24), bVar2 != '\0')))) {
        if (u.uprops[0x1d].intrinsic == 0) {
          if (u.uhs < 3) {
            pcVar6 = beautiful();
            pline("You look as %s as ever.",pcVar6);
          }
          else {
            pline("You look %s.","undernourished");
          }
        }
        else {
          pline("You look %s.","peaked");
        }
      }
      else {
        pcVar6 = hcolor((char *)0x0);
        pline("You look %s.",pcVar6);
      }
    }
    else {
      pcVar6 = beautiful();
      pcVar5 = body_part(2);
      pline("You can\'t see your %s %s.",pcVar6,pcVar5);
    }
    return 1;
  }
  if ((u._1052_1_ & 1) != 0) {
    if (((u.uprops[0x1e].intrinsic == 0) &&
        (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
         (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
       ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
      pcVar6 = mon_nam(u.ustuck);
      pcVar6 = s_suffix(pcVar6);
      pcVar5 = mbodypart(u.ustuck,0x12);
      pline("You reflect %s %s.",pcVar6,pcVar5);
    }
    return 1;
  }
  if (((byte)u._1052_1_ >> 1 & 1) != 0) {
    bVar7 = false;
    if (u.uprops[0x23].intrinsic != 0) {
      bVar7 = true;
      if ((u.uprops[0x24].extrinsic == 0) && (bVar7 = false, u.umonnum != u.umonster)) {
        bVar2 = dmgtype(youmonst.data,0x24);
        bVar7 = bVar2 != '\0';
      }
      bVar7 = (bool)(bVar7 ^ 1);
    }
    pcVar6 = "You reflect the murky water.";
    if (bVar7) {
      pcVar6 = "You give the fish a chance to fix their makeup.";
    }
    pline(pcVar6);
    return 1;
  }
  if (local_25 != '\0') {
    if (((u.uprops[0x1e].intrinsic == 0) &&
        (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
         (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
       ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
      if (local_25 < '\x01') {
        local_58 = ceiling((int)u.ux,(int)u.uy);
      }
      else {
        local_58 = surface((int)u.ux,(int)u.uy);
      }
      pline("You reflect the %s.",local_58);
    }
    return 1;
  }
  pmStack_20 = beam_hit((int)tmp._1_1_,(int)(char)tmp,0x50,4,(_func_int_monst_ptr_obj_ptr *)0x0,
                        (_func_int_obj_ptr_obj_ptr *)0x0,(obj *)mtmp,(boolean *)0x0);
  if ((pmStack_20 == (monst *)0x0) || ((pmStack_20->data->mflags1 & 0x1000) != 0)) {
    return 1;
  }
  if (pmStack_20->wormno == '\0') {
    if ((viz_array[pmStack_20->my][pmStack_20->mx] & 2U) == 0) {
      if ((((u.uprops[0x1e].intrinsic != 0) ||
           (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
            (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
          ((local_59 = 0, ublindf == (obj *)0x0 || (local_59 = 0, ublindf->oartifact != '\x1d'))))
         || (((u.uprops[0x40].intrinsic == 0 &&
              ((u.uprops[0x40].extrinsic == 0 &&
               (local_59 = 0, ((youmonst.data)->mflags3 & 0x100) == 0)))) ||
             (local_59 = 0, (pmStack_20->data->mflags3 & 0x200) == 0)))) goto LAB_001504d3;
      bVar3 = viz_array[pmStack_20->my][pmStack_20->mx] & 1;
      goto joined_r0x00150420;
    }
  }
  else {
    bVar3 = worm_known(level,pmStack_20);
joined_r0x00150420:
    local_59 = 0;
    if (bVar3 == 0) goto LAB_001504d3;
  }
  if ((((((*(uint *)&pmStack_20->field_0x60 >> 1 & 1) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
       (u.uprops[0xc].extrinsic != 0)) ||
      (local_5a = 0, ((youmonst.data)->mflags1 & 0x1000000) != 0)) &&
     (local_5a = 0, (*(uint *)&pmStack_20->field_0x60 >> 7 & 1) == 0)) {
    local_5b = (*(uint *)&pmStack_20->field_0x60 >> 9 & 1) != 0 || ((byte)u._1052_1_ >> 5 & 1) != 0;
    local_5a = local_5b ^ 0xff;
  }
  local_59 = local_5a;
LAB_001504d3:
  tmp._2_1_ = local_59 & 1;
  tmp._3_1_ = pmStack_20->data->mlet;
  if ((*(uint *)&pmStack_20->field_0x60 >> 0x13 & 1) == 0) {
    if ((*(uint *)&pmStack_20->field_0x60 >> 0x11 & 1) == 0) {
      if (tmp._2_1_ != 0) {
        pcVar6 = Monnam(pmStack_20);
        pline("%s can\'t see anything right now.",pcVar6);
      }
    }
    else if (((pmStack_20->data->mlet == '0') || ((pmStack_20->data->mflags2 & 0x100) != 0)) ||
            (tmp._3_1_ == '6')) {
      if (tmp._2_1_ != 0) {
        pcVar6 = Monnam(pmStack_20);
        pline("%s doesn\'t have a reflection.",pcVar6);
      }
    }
    else if ((((*(uint *)&pmStack_20->field_0x60 >> 8 & 1) == 0) &&
             ((*(uint *)&pmStack_20->field_0x60 >> 1 & 1) == 0)) &&
            (pmStack_20->data == mons + 0x127)) {
      bVar2 = mon_reflects(pmStack_20,"The gaze is reflected away by %s %s!");
      if (bVar2 != '\0') {
        return 1;
      }
      if (tmp._2_1_ != 0) {
        pcVar6 = Monnam(pmStack_20);
        pline("%s is turned to stone!",pcVar6);
      }
      stoned = '\x01';
      killed(pmStack_20);
    }
    else if ((((*(uint *)&pmStack_20->field_0x60 >> 8 & 1) == 0) &&
             ((*(uint *)&pmStack_20->field_0x60 >> 1 & 1) == 0)) &&
            (pmStack_20->data == mons + 0x1e)) {
      local_2c = dice((uint)pmStack_20->m_lev,(uint)pmStack_20->data->mattk[0].damd);
      iVar4 = rn2(4);
      if (iVar4 == 0) {
        local_2c = 0x78;
      }
      if (tmp._2_1_ == 0) {
        You_hear("something stop moving.");
      }
      else {
        pcVar6 = Monnam(pmStack_20);
        pline("%s is frozen by its reflection.",pcVar6);
      }
      *(uint *)&pmStack_20->field_0x60 = *(uint *)&pmStack_20->field_0x60 & 0xfffbffff;
      if ((int)((uint)pmStack_20->mfrozen + local_2c) < 0x80) {
        pmStack_20->mfrozen = pmStack_20->mfrozen + (char)local_2c;
      }
      else {
        pmStack_20->mfrozen = '\x7f';
      }
    }
    else if ((((*(uint *)&pmStack_20->field_0x60 >> 8 & 1) == 0) &&
             ((*(uint *)&pmStack_20->field_0x60 >> 1 & 1) == 0)) &&
            (pmStack_20->data == mons + 0xe7)) {
      if (tmp._2_1_ != 0) {
        pcVar6 = Monnam(pmStack_20);
        pline("%s confuses itself!",pcVar6);
      }
      *(uint *)&pmStack_20->field_0x60 = *(uint *)&pmStack_20->field_0x60 & 0xffdfffff | 0x200000;
    }
    else if ((((*(uint *)&pmStack_20->field_0x60 >> 8 & 1) == 0) &&
             ((*(uint *)&pmStack_20->field_0x60 >> 1 & 1) == 0)) &&
            ((tmp._3_1_ == '\x0e' || (pmStack_20->data == mons + 0x12f)))) {
      if (tmp._2_1_ == 0) {
        pline("It steals your mirror!");
      }
      else {
        pcVar6 = Monnam(pmStack_20);
        pline("%s admires herself in your mirror.",pcVar6);
        pline("She takes it!");
      }
      setnotworn((obj *)mtmp);
      freeinv((obj *)mtmp);
      mpickobj(pmStack_20,(obj *)mtmp);
      bVar2 = tele_restrict(pmStack_20);
      if (bVar2 == '\0') {
        rloc(level,pmStack_20,'\0');
      }
    }
    else if (((((pmStack_20->data->mlet == '\x15') &&
               ((pmStack_20->data->mflags2 & 0x20000000) != 0)) ||
              ((pmStack_20->data->mflags1 & 0x20000) != 0)) ||
             (((*(uint *)&pmStack_20->field_0x60 >> 1 & 1) != 0 &&
              ((pmStack_20->data->mflags1 & 0x1000000) == 0)))) || (iVar4 = rn2(5), iVar4 == 0)) {
      if (((((u.uprops[0x1e].intrinsic == 0) && ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))
            ) && (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
          ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
         (((*(uint *)&pmStack_20->field_0x60 >> 1 & 1) == 0 ||
          (((u.uprops[0xc].intrinsic != 0 || (u.uprops[0xc].extrinsic != 0)) ||
           (((youmonst.data)->mflags1 & 0x1000000) != 0)))))) {
        if ((((*(uint *)&pmStack_20->field_0x60 >> 1 & 1) == 0) ||
            ((pmStack_20->data->mflags1 & 0x1000000) != 0)) &&
           ((pmStack_20->data->mflags1 & 0x1000) == 0)) {
          pcVar6 = Monnam(pmStack_20);
          iVar4 = pronoun_gender(level,pmStack_20);
          pline("%s ignores %s reflection.",pcVar6,genders[iVar4].his);
        }
        else {
          pcVar6 = Monnam(pmStack_20);
          pline("%s doesn\'t seem to notice its reflection.",pcVar6);
        }
      }
    }
    else {
      if (tmp._2_1_ != 0) {
        pcVar6 = Monnam(pmStack_20);
        pline("%s is frightened by its reflection.",pcVar6);
      }
      mtmp_00 = pmStack_20;
      iVar4 = dice(2,4);
      monflee(mtmp_00,iVar4,'\0','\0');
    }
  }
  else if (tmp._2_1_ != 0) {
    pcVar6 = Monnam(pmStack_20);
    pline("%s is too tired to look at your mirror.",pcVar6);
  }
  return 1;
}

Assistant:

static int use_mirror(struct obj *obj)
{
	struct monst *mtmp;
	char mlet;
	boolean vis;
	schar dx, dy, dz;

	if (!getdir(NULL, &dx, &dy, &dz))
	    return 0;
	
	if (obj->cursed && !rn2(2)) {
		if (!Blind)
			pline("The mirror fogs up and doesn't reflect!");
		return 1;
	}
	if (!dx && !dy && !dz) {
		if (!Blind && !Invisible) {
		    if (u.umonnum == PM_FLOATING_EYE) {
			if (!Free_action) {
			    pline(Hallucination ?
				"Yow!  The mirror stares back!" :
				"Yikes!  You've frozen yourself!");
			    nomul(-rnd((MAXULEV+6) - u.ulevel), "gazing into a mirror");
			} else pline("You stiffen momentarily under your gaze.");
		    } else if (is_vampire(youmonst.data))
			pline("You don't have a reflection.");
		    else if (u.umonnum == PM_UMBER_HULK) {
			pline("Huh?  That doesn't look like you!");
			make_confused(HConfusion + dice(3,4), FALSE);
		    } else if (Hallucination)
			pline(look_str, hcolor(NULL));
		    else if (Sick)
			pline(look_str, "peaked");
		    else if (u.uhs >= WEAK)
			pline(look_str, "undernourished");
		    else pline("You look as %s as ever.", beautiful());
		} else {
			pline("You can't see your %s %s.",
				beautiful(),
				body_part(FACE));
		}
		return 1;
	}
	if (u.uswallow) {
		if (!Blind) pline("You reflect %s %s.", s_suffix(mon_nam(u.ustuck)),
		    mbodypart(u.ustuck, STOMACH));
		return 1;
	}
	if (Underwater) {
		pline(Hallucination ?
		    "You give the fish a chance to fix their makeup." :
		    "You reflect the murky water.");
		return 1;
	}
	if (dz) {
		if (!Blind)
		    pline("You reflect the %s.",
			(dz > 0) ? surface(u.ux,u.uy) : ceiling(u.ux,u.uy));
		return 1;
	}
	mtmp = beam_hit(dx, dy, COLNO, INVIS_BEAM, NULL, NULL, obj, NULL);
	if (!mtmp || !haseyes(mtmp->data))
		return 1;

	vis = canseemon(level, mtmp);
	mlet = mtmp->data->mlet;
	if (mtmp->msleeping) {
		if (vis)
		    pline ("%s is too tired to look at your mirror.",
			    Monnam(mtmp));
	} else if (!mtmp->mcansee) {
	    if (vis)
		pline("%s can't see anything right now.", Monnam(mtmp));
	/* some monsters do special things */
	} else if (is_vampire(mtmp->data) || mlet == S_GHOST) {
	    if (vis)
		pline ("%s doesn't have a reflection.", Monnam(mtmp));
	} else if (!mtmp->mcan && !mtmp->minvis &&
					mtmp->data == &mons[PM_MEDUSA]) {
		if (mon_reflects(mtmp, "The gaze is reflected away by %s %s!"))
			return 1;
		if (vis)
			pline("%s is turned to stone!", Monnam(mtmp));
		stoned = TRUE;
		killed(mtmp);
	} else if (!mtmp->mcan && !mtmp->minvis &&
					mtmp->data == &mons[PM_FLOATING_EYE]) {
		int tmp = dice((int)mtmp->m_lev, (int)mtmp->data->mattk[0].damd);
		if (!rn2(4)) tmp = 120;
		if (vis)
			pline("%s is frozen by its reflection.", Monnam(mtmp));
		else You_hear("something stop moving.");
		mtmp->mcanmove = 0;
		if ( (int) mtmp->mfrozen + tmp > 127)
			mtmp->mfrozen = 127;
		else mtmp->mfrozen += tmp;
	} else if (!mtmp->mcan && !mtmp->minvis &&
					mtmp->data == &mons[PM_UMBER_HULK]) {
		if (vis)
			pline ("%s confuses itself!", Monnam(mtmp));
		mtmp->mconf = 1;
	} else if (!mtmp->mcan && !mtmp->minvis && (mlet == S_NYMPH
				     || mtmp->data==&mons[PM_SUCCUBUS])) {
		if (vis) {
		    pline ("%s admires herself in your mirror.", Monnam(mtmp));
		    pline ("She takes it!");
		} else pline ("It steals your mirror!");
		setnotworn(obj); /* in case mirror was wielded */
		freeinv(obj);
		mpickobj(mtmp,obj);
		if (!tele_restrict(mtmp)) rloc(level, mtmp, FALSE);
	} else if (!is_unicorn(mtmp->data) && !humanoid(mtmp->data) &&
			(!mtmp->minvis || perceives(mtmp->data)) && rn2(5)) {
		if (vis)
		    pline("%s is frightened by its reflection.", Monnam(mtmp));
		monflee(mtmp, dice(2,4), FALSE, FALSE);
	} else if (!Blind) {
		if (mtmp->minvis && !See_invisible)
		    ;
		else if ((mtmp->minvis && !perceives(mtmp->data))
			 || !haseyes(mtmp->data))
		    pline("%s doesn't seem to notice its reflection.",
			Monnam(mtmp));
		else
		    pline("%s ignores %s reflection.",
			  Monnam(mtmp), mhis(level, mtmp));
	}
	return 1;
}